

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionRequest.c
# Opt level: O2

int UpnpActionRequest_assign(UpnpActionRequest *p,UpnpActionRequest *q)

{
  IXML_Document *pIVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  sockaddr_storage *psVar11;
  sockaddr_storage *psVar12;
  byte bVar13;
  
  bVar13 = 0;
  if (p == q) {
    uVar10 = 1;
  }
  else {
    iVar8 = q->m_Socket;
    p->m_ErrCode = q->m_ErrCode;
    p->m_Socket = iVar8;
    iVar8 = UpnpActionRequest_set_ErrStr(p,q->m_ErrStr);
    uVar10 = 0;
    if (iVar8 != 0) {
      iVar8 = UpnpActionRequest_set_ActionName(p,q->m_ActionName);
      if (iVar8 != 0) {
        iVar8 = UpnpActionRequest_set_DevUDN(p,q->m_DevUDN);
        uVar10 = 0;
        if (iVar8 != 0) {
          iVar8 = UpnpActionRequest_set_ServiceID(p,q->m_ServiceID);
          if (iVar8 != 0) {
            pIVar1 = q->m_ActionResult;
            p->m_ActionRequest = q->m_ActionRequest;
            p->m_ActionResult = pIVar1;
            p->m_SoapHeader = q->m_SoapHeader;
            psVar11 = &q->m_CtrlPtIPAddr;
            psVar12 = &p->m_CtrlPtIPAddr;
            for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
              cVar2 = psVar11->__ss_padding[0];
              cVar3 = psVar11->__ss_padding[1];
              cVar4 = psVar11->__ss_padding[2];
              cVar5 = psVar11->__ss_padding[3];
              cVar6 = psVar11->__ss_padding[4];
              cVar7 = psVar11->__ss_padding[5];
              psVar12->ss_family = psVar11->ss_family;
              psVar12->__ss_padding[0] = cVar2;
              psVar12->__ss_padding[1] = cVar3;
              psVar12->__ss_padding[2] = cVar4;
              psVar12->__ss_padding[3] = cVar5;
              psVar12->__ss_padding[4] = cVar6;
              psVar12->__ss_padding[5] = cVar7;
              psVar11 = (sockaddr_storage *)((long)psVar11 + (ulong)bVar13 * -0x10 + 8);
              psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar13 * -0x10 + 8);
            }
            iVar8 = UpnpActionRequest_set_Os(p,q->m_Os);
            uVar10 = (uint)(iVar8 != 0);
          }
        }
      }
    }
  }
  return uVar10;
}

Assistant:

int UpnpActionRequest_assign(UpnpActionRequest *p, const UpnpActionRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionRequest_set_ErrCode(
				   p, UpnpActionRequest_get_ErrCode(q));
		ok = ok && UpnpActionRequest_set_Socket(
				   p, UpnpActionRequest_get_Socket(q));
		ok = ok && UpnpActionRequest_set_ErrStr(
				   p, UpnpActionRequest_get_ErrStr(q));
		ok = ok && UpnpActionRequest_set_ActionName(
				   p, UpnpActionRequest_get_ActionName(q));
		ok = ok && UpnpActionRequest_set_DevUDN(
				   p, UpnpActionRequest_get_DevUDN(q));
		ok = ok && UpnpActionRequest_set_ServiceID(
				   p, UpnpActionRequest_get_ServiceID(q));
		ok = ok && UpnpActionRequest_set_ActionRequest(
				   p, UpnpActionRequest_get_ActionRequest(q));
		ok = ok && UpnpActionRequest_set_ActionResult(
				   p, UpnpActionRequest_get_ActionResult(q));
		ok = ok && UpnpActionRequest_set_SoapHeader(
				   p, UpnpActionRequest_get_SoapHeader(q));
		ok = ok && UpnpActionRequest_set_CtrlPtIPAddr(
				   p, UpnpActionRequest_get_CtrlPtIPAddr(q));
		ok = ok &&
		     UpnpActionRequest_set_Os(p, UpnpActionRequest_get_Os(q));
	}

	return ok;
}